

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_io.cc
# Opt level: O3

Ptr __thiscall core::image::load_pfm_file(image *this,string *filename)

{
  image *piVar1;
  float fVar2;
  int iVar3;
  image *piVar4;
  int iVar5;
  istream *this_00;
  float *pfVar6;
  Image<float> *__p;
  ulong uVar7;
  FileException *this_01;
  int *piVar8;
  char *msg;
  Exception *pEVar9;
  long lVar10;
  long lVar11;
  float *pfVar12;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  int iVar13;
  float *pfVar14;
  ulong uVar15;
  int iVar16;
  uint uVar17;
  ulong uVar18;
  Ptr PVar19;
  long local_280;
  ifstream in;
  int aiStack_260 [122];
  string local_78;
  image *local_58;
  int local_4c;
  image *piStack_48;
  int width;
  Ptr *image;
  char local_36;
  char temp;
  int height;
  char signature [2];
  float scale;
  
  piStack_48 = this;
  std::ifstream::ifstream(&local_280,(filename->_M_dataplus)._M_p,_S_in);
  if (*(int *)((long)aiStack_260 + *(long *)(local_280 + -0x18)) != 0) {
    this_01 = (FileException *)__cxa_allocate_exception(0x48);
    piVar8 = __errno_location();
    msg = strerror(*piVar8);
    util::FileException::FileException(this_01,filename,msg);
    __cxa_throw(this_01,&util::FileException::typeinfo,util::FileException::~FileException);
  }
  std::istream::read((char *)&local_280,(long)&local_36);
  iVar16 = 1;
  if ((temp != 'f' || local_36 != 'P') && ((local_36 != 'P' || (iVar16 = 3, temp != 'F')))) {
    std::ifstream::close();
    pEVar9 = (Exception *)__cxa_allocate_exception(0x28);
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_78,"PPM signature did not match","");
    util::Exception::Exception(pEVar9,&local_78);
    __cxa_throw(pEVar9,&util::Exception::typeinfo,util::Exception::~Exception);
  }
  local_4c = 0;
  image._4_4_ = 0;
  height = -0x40800000;
  this_00 = (istream *)std::istream::operator>>((istream *)&local_280,&local_4c);
  pfVar6 = (float *)std::istream::operator>>(this_00,(int *)((long)&image + 4));
  std::istream::_M_extract<float>(pfVar6);
  std::istream::read((char *)&local_280,(long)&image + 3);
  iVar5 = image._4_4_;
  iVar3 = local_4c;
  iVar13 = image._4_4_ * local_4c;
  if (0x10000000 < iVar13) {
    std::ifstream::close();
    pEVar9 = (Exception *)__cxa_allocate_exception(0x28);
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"Image too friggin huge","")
    ;
    util::Exception::Exception(pEVar9,&local_78);
    __cxa_throw(pEVar9,&util::Exception::typeinfo,util::Exception::~Exception);
  }
  __p = (Image<float> *)operator_new(0x30);
  (__p->super_TypedImageBase<float>).data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__p->super_TypedImageBase<float>).data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__p->super_TypedImageBase<float>).data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__p->super_TypedImageBase<float>).super_ImageBase._vptr_ImageBase =
       (_func_int **)&PTR__TypedImageBase_0012fb60;
  (__p->super_TypedImageBase<float>).super_ImageBase.w = iVar3;
  (__p->super_TypedImageBase<float>).super_ImageBase.h = iVar5;
  (__p->super_TypedImageBase<float>).super_ImageBase.c = iVar16;
  std::vector<float,_std::allocator<float>_>::resize
            (&(__p->super_TypedImageBase<float>).data,(long)(iVar13 * iVar16));
  *(Image<float> **)piStack_48 = __p;
  piVar1 = piStack_48 + 8;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<core::Image<float>*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)piVar1,__p);
  piVar4 = piStack_48;
  local_58 = piVar1;
  uVar7 = (**(code **)(**(long **)piStack_48 + 0x18))();
  lVar11 = *(long *)piVar4;
  iVar16 = *(int *)(lVar11 + 0xc);
  uVar18 = 0;
  if (0 < image._4_4_) {
    lVar10 = *(long *)(lVar11 + 0x20) - *(ulong *)(lVar11 + 0x18);
    uVar15 = *(ulong *)(lVar11 + 0x18);
    if (lVar10 == 0) {
      uVar15 = uVar18;
    }
    uVar15 = uVar15 + lVar10;
    if (lVar10 == 0) {
      uVar15 = uVar18;
    }
    do {
      uVar15 = uVar15 - uVar7 / (ulong)(long)iVar16;
      std::istream::read((char *)&local_280,uVar15);
      uVar17 = (int)uVar18 + 1;
      uVar18 = (ulong)uVar17;
    } while ((int)uVar17 < image._4_4_);
  }
  std::ifstream::close();
  piVar1 = piStack_48;
  pfVar6 = *(float **)(*(long *)piStack_48 + 0x18);
  lVar11 = *(long *)(*(long *)piStack_48 + 0x20);
  lVar10 = lVar11 - (long)pfVar6;
  pfVar12 = pfVar6;
  if (lVar10 == 0) {
    pfVar12 = (float *)0x0;
  }
  pfVar14 = (float *)((long)pfVar12 + lVar10);
  if (lVar10 == 0) {
    pfVar14 = (float *)0x0;
  }
  if (0.0 <= (float)height) {
    for (; pfVar12 != pfVar14; pfVar12 = pfVar12 + 1) {
      fVar2 = *pfVar12;
      *pfVar12 = (float)((uint)fVar2 >> 0x18 | ((uint)fVar2 & 0xff0000) >> 8 |
                         ((uint)fVar2 & 0xff00) << 8 | (int)fVar2 << 0x18);
    }
  }
  else {
    height = height ^ 0x80000000;
  }
  if (((float)height != 1.0) || (NAN((float)height))) {
    lVar11 = lVar11 - (long)pfVar6;
    if (lVar11 == 0) {
      pfVar6 = (float *)0x0;
    }
    pfVar12 = (float *)((long)pfVar6 + lVar11);
    if (lVar11 == 0) {
      pfVar12 = (float *)0x0;
    }
    for (; pfVar6 != pfVar12; pfVar6 = pfVar6 + 1) {
      *pfVar6 = *pfVar6 * (float)height;
    }
  }
  std::ifstream::~ifstream(&local_280);
  PVar19.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  PVar19.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)piVar1;
  return (Ptr)PVar19.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

FloatImage::Ptr
load_pfm_file (std::string const& filename)
{
    std::ifstream in(filename.c_str());
    if (!in.good())
        throw util::FileException(filename, std::strerror(errno));

    char signature[2];
    in.read(signature, 2);

    // check signature and determine channels
    int channels = 0;
    if (signature[0] == 'P' && signature[1] == 'f')
        channels = 1;
    else if (signature[0] == 'P' && signature[1] == 'F')
        channels = 3;
    else
    {
        in.close();
        throw util::Exception("PPM signature did not match");
    }

    /* Read width and height as well as max value. */
    int width = 0;
    int height = 0;
    float scale = -1.0;
    in >> width >> height >> scale;

    /* Read final whitespace character. */
    char temp;
    in.read(&temp, 1);

    /* Check image width and height. Shouldn't be too large. */
    if (width * height > PPM_MAX_PIXEL_AMOUNT)
    {
        in.close();
        throw util::Exception("Image too friggin huge");
    }

    /* Read image rows in reverse order according to PFM specification. */
    FloatImage::Ptr image = FloatImage::create(width, height, channels);
    std::size_t row_size = image->get_byte_size() / image->height();
    char* ptr = reinterpret_cast<char*>(image->end()) - row_size;
    for (int y = 0; y < height; ++y, ptr -= row_size)
        in.read(ptr, row_size);
    in.close();

    /* Handle endianess. BE if scale > 0, LE if scale < 0. */
    if (scale < 0.0f)
    {
        std::transform(image->begin(), image->end(), image->begin(),
            (float(*)(float const&))util::system::letoh<float>);
        scale = -scale;
    }
    else
    {
        std::transform(image->begin(), image->end(), image->begin(),
            (float(*)(float const&))util::system::betoh<float>);
    }

    /* Handle scale. Multiply image values if scale is not 1.0. */
    if (scale != 1.0f)
    {
        std::for_each(image->begin(), image->end(),
            math::algo::foreach_multiply_with_const<float>(scale));
    }

   return image;
}